

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O3

void cluster_preprocess(int n,vec3f *positions,int *clusterids,SphereTree *hierarchy,int *sphcnt)

{
  pointer *__return_storage_ptr__;
  data_t dVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [8];
  uint uVar8;
  float *data;
  float *data_00;
  float *pfVar9;
  undefined8 *puVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  data_t *pdVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  int k;
  long lVar21;
  void *pvVar22;
  int c;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vec3f cluster_center;
  undefined8 uStack_110;
  undefined8 auStack_108 [2];
  float afStack_f8 [2];
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> recv_cnt;
  vector<vec3f,_std::allocator<vec3f>_> recv_sum;
  undefined1 local_a0 [8];
  vector<float,_std::allocator<float>_> cluster_radius;
  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  blockers;
  vector<float,_std::allocator<float>_> cluster_blocker_count;
  
  auStack_108[1] = 0x159af2;
  github111116::ConsoleLogger::log<char[26]>(&console,(char (*) [26])"per-cluster processing...");
  uVar16 = (ulong)(uint)n;
  if (n < 1) {
    uVar8 = 1;
  }
  else {
    uVar12 = 0;
    iVar14 = 0;
    do {
      iVar11 = clusterids[uVar12];
      if (clusterids[uVar12] < iVar14) {
        iVar11 = iVar14;
      }
      iVar14 = iVar11;
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
    uVar8 = iVar14 + 1;
  }
  uVar12 = (ulong)uVar8;
  recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  auStack_108[1] = 0x159b4b;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f0,uVar12,
             (value_type_conflict5 *)
             &recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(allocator_type *)local_a0);
  local_a0 = (undefined1  [8])0x0;
  cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  auStack_108[1] = 0x159b76;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)
             &recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,uVar12,(value_type *)local_a0,
             (allocator_type *)
             &blockers.
              super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (0 < n) {
    lVar6 = CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_);
    pdVar15 = &positions->z;
    uVar17 = 0;
    do {
      lVar18 = (long)clusterids[uVar17];
      *(int *)((long)local_f0 + lVar18 * 4) = *(int *)((long)local_f0 + lVar18 * 4) + 1;
      uVar2 = ((vec3f *)(pdVar15 + -2))->x;
      uVar4 = ((vec3f *)(pdVar15 + -2))->y;
      uVar3 = *(undefined8 *)(lVar6 + lVar18 * 0xc);
      *(ulong *)(lVar6 + lVar18 * 0xc) =
           CONCAT44((float)((ulong)uVar3 >> 0x20) + (float)uVar4,(float)uVar3 + (float)uVar2);
      *(float *)(lVar6 + 8 + lVar18 * 0xc) = *pdVar15 + *(float *)(lVar6 + 8 + lVar18 * 0xc);
      uVar17 = uVar17 + 1;
      pdVar15 = pdVar15 + 3;
    } while (uVar16 != uVar17);
  }
  lVar6 = -(uVar12 * 0xc + 0xf & 0xfffffffffffffff0);
  pvVar22 = (void *)((long)afStack_f8 + lVar6);
  uVar17 = 0;
  *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159c26;
  memset(pvVar22,0,((uVar12 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  lVar18 = 2;
  do {
    iVar14 = *(int *)((long)local_f0 + uVar17 * 4);
    fVar23 = (float)iVar14;
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         *(ulong *)(CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) + -8 + lVar18 * 4);
    fVar24 = *(float *)(CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_,
                                 recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._0_4_) + lVar18 * 4);
    auVar26._4_4_ = fVar23;
    auVar26._0_4_ = fVar23;
    auVar26._8_8_ = 0;
    auVar26 = divps(auVar25,auVar26);
    *(long *)((long)afStack_f8 + lVar18 * 4 + lVar6 + -8) = auVar26._0_8_;
    *(float *)((long)pvVar22 + lVar18 * 4) = fVar24 / fVar23;
    if (iVar14 == 0) {
      *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159c7f;
      github111116::ConsoleLogger::debug<char[36]>
                (&console,(char (*) [36])"encountering empty receiver cluster");
      *(undefined8 *)((long)afStack_f8 + lVar18 * 4 + lVar6 + -8) = 0;
      *(undefined4 *)((long)pvVar22 + lVar18 * 4) = 0;
    }
    uVar17 = uVar17 + 1;
    lVar18 = lVar18 + 3;
  } while (uVar12 != uVar17);
  blockers.
  super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159cbb;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a0,uVar12,
             (value_type *)
             &blockers.
              super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (allocator_type *)
             &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (0 < n) {
    pdVar15 = &positions->z;
    uVar17 = 0;
    do {
      lVar18 = (long)clusterids[uVar17];
      fVar24 = ((vec3f *)(pdVar15 + -2))->x - *(float *)((long)pvVar22 + lVar18 * 0xc);
      fVar23 = pdVar15[-1] - *(float *)((long)afStack_f8 + lVar18 * 0xc + lVar6 + 4);
      fVar24 = SQRT((*pdVar15 - *(float *)(local_f0 + lVar18 * 0xc + lVar6)) *
                    (*pdVar15 - *(float *)(local_f0 + lVar18 * 0xc + lVar6)) +
                    fVar24 * fVar24 + fVar23 * fVar23);
      if (fVar24 <= *(float *)((long)local_a0 + lVar18 * 4)) {
        fVar24 = *(float *)((long)local_a0 + lVar18 * 4);
      }
      *(float *)((long)local_a0 + lVar18 * 4) = fVar24;
      uVar17 = uVar17 + 1;
      pdVar15 = pdVar15 + 3;
    } while (uVar16 != uVar17);
  }
  *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159d3a;
  data = (float *)operator_new__(0x1000000);
  *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159d48;
  data_00 = (float *)operator_new__(0x3c00000);
  cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((ulong)cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159d66;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &blockers.
              super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar12,
             (value_type *)
             &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (allocator_type *)
             ((long)&cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 4));
  uVar17 = 0;
  __return_storage_ptr__ =
       &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  pfVar9 = data_00;
  while( true ) {
    uVar3 = *(undefined8 *)((long)pvVar22 + uVar17 * 0xc);
    dVar1 = *(data_t *)(local_f0 + uVar17 * 0xc + lVar6);
    fVar24 = *(float *)((long)local_a0 + uVar17 * 4);
    *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159db1;
    cluster_center.z = dVar1;
    cluster_center._0_8_ = uVar3;
    treecut_ratio((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   *)__return_storage_ptr__,hierarchy,cluster_center,fVar24,
                  (anonymous_namespace)::theta_max,(anonymous_namespace)::theta_min);
    if (0x3ff < uVar17) break;
    uVar13 = ((long)blockers.
                    super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage >> 3) * -0x3333333333333333;
    if (0x400 < uVar13) break;
    if (blockers.
        super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
      lVar18 = 0;
      pfVar19 = pfVar9;
      do {
        uVar3 = *(undefined8 *)
                 (cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + lVar18 * 10 + 2);
        *(undefined8 *)(data + uVar17 * 0x1000 + lVar18 * 4) =
             *(undefined8 *)
              (cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar18 * 10);
        *(undefined8 *)(data + uVar17 * 0x1000 + lVar18 * 4 + 2) = uVar3;
        lVar5 = *(long *)(cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + lVar18 * 10 + 4);
        lVar21 = 0;
        pfVar20 = pfVar19;
        do {
          *pfVar20 = *(float *)(lVar5 + lVar21 * 4);
          lVar21 = lVar21 + 1;
          pfVar20 = pfVar20 + 0x100000;
        } while (lVar21 != 0xf);
        lVar18 = lVar18 + 1;
        pfVar19 = pfVar19 + 1;
      } while (lVar18 != uVar13 + (uVar13 == 0));
    }
    *(float *)(CONCAT44(blockers.
                        super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        blockers.
                        super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) + uVar17 * 4) =
         (float)(long)uVar13;
    *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159e6d;
    std::
    vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~vector((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
               *)__return_storage_ptr__);
    uVar17 = uVar17 + 1;
    pfVar9 = pfVar9 + 0x400;
    if (uVar17 == uVar12) {
      *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159e90;
      (*glad_glActiveTexture)(0x84c4);
      *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159eb8;
      create_2D_float_texture(0x400,0x400,4,data,0x2600,false);
      *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159ec0;
      (*glad_glActiveTexture)(0x84c5);
      *(undefined8 *)((long)auStack_108 + lVar6) = 0;
      *(undefined8 *)((long)&uStack_110 + lVar6) = 0x159ee8;
      create_2D_float_texture_array
                (0x400,0x400,1,0xf,data_00,0x2600,*(bool *)((long)auStack_108 + lVar6));
      *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159ef5;
      operator_delete__(data);
      *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159efd;
      operator_delete__(data_00);
      pfVar9 = (float *)CONCAT44(blockers.
                                 super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 blockers.
                                 super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      if (0 < n) {
        uVar12 = 0;
        do {
          sphcnt[uVar12] = (int)pfVar9[clusterids[uVar12]];
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
      }
      if (pfVar9 == cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        iVar14 = 0;
      }
      else {
        iVar14 = 0;
        cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        do {
          iVar11 = (int)*pfVar9;
          iVar14 = iVar14 + iVar11;
          if (iVar11 < cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
            iVar11 = cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_;
          }
          cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = iVar11;
          pfVar9 = pfVar9 + 1;
        } while (pfVar9 != cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        iVar14 = iVar14 * 10;
      }
      *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159f71;
      github111116::ConsoleLogger::log<char[27],int>
                (&console,(char (*) [27])"max #blockers per cluster:",
                 (int *)((long)&cluster_blocker_count.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4));
      cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)((double)(iVar14 / (int)uVar8) * 0.1);
      *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159f9f;
      github111116::ConsoleLogger::log<char[27],double>
                (&console,(char (*) [27])"avg #blockers per cluster:",
                 (double *)
                 &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pvVar22 = (void *)CONCAT44(blockers.
                                 super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 blockers.
                                 super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      if (pvVar22 != (void *)0x0) {
        *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159fad;
        operator_delete(pvVar22);
      }
      auVar7 = local_a0;
      if (local_a0 != (undefined1  [8])0x0) {
        *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x159fbe;
        operator_delete((void *)auVar7);
      }
      if ((void *)CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,
                           recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._0_4_) != (void *)0x0) {
        auStack_108[1] = 0x159fd6;
        operator_delete((void *)CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         recv_cnt.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_));
      }
      if (local_f0 != (undefined1  [8])0x0) {
        auStack_108[1] = 0x159fe7;
        operator_delete((void *)local_f0);
      }
      return;
    }
  }
  *(undefined8 *)((long)afStack_f8 + lVar6 + -8) = 0x15a000;
  puVar10 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar10 = "sphere texture overflowing";
  *(undefined1 **)((long)afStack_f8 + lVar6 + -8) = &LAB_0015a01b;
  __cxa_throw(puVar10,&char_const*::typeinfo,0);
}

Assistant:

void cluster_preprocess(int n, const vec3f* positions, const int* clusterids, const SphereTree& hierarchy, int* sphcnt)
{
	console.log("per-cluster processing...");
	// calculate number of clusters
	int maxcluster = 0;
	for (int recv=0; recv<n; ++recv)
		maxcluster = std::max(maxcluster, clusterids[recv]);
	int n_cluster = maxcluster+1;
	// calculate centers of clusters (average over all receivers)
	std::vector<int> recv_cnt(n_cluster,0);
	std::vector<vec3f> recv_sum(n_cluster,0);
	for (int recv=0; recv<n; ++recv) {
		int c = clusterids[recv];
		recv_cnt[c] += 1;
		recv_sum[c] += positions[recv];
	}
	vec3f cluster_center[n_cluster];
	for (int c=0; c<n_cluster; ++c) {
		cluster_center[c] = recv_sum[c] / recv_cnt[c];
		if (recv_cnt[c] == 0) {
			console.debug("encountering empty receiver cluster");
			cluster_center[c] = vec3f(0,0,0);
		}
	}
	// calculate bounding radius of clusters
	std::vector<float> cluster_radius(n_cluster,0);
	for (int recv=0; recv<n; ++recv) {
		int c = clusterids[recv];
		cluster_radius[c] = std::max(cluster_radius[c], norm(positions[recv] - cluster_center[c]));
	}
	// prepare texture data
	static const int texwidth = 1024; // max number of spheres per cluster
	static const int texheight = 1024; // max number of cluster
	float* sphdata = new float[texheight * texwidth * 4];
	float* ratiodata = new float[shorder * texheight * texwidth];
	// assemble bounding sphere nodes for shading each cluster
	std::vector<float> cluster_blocker_count(n_cluster,0);
	for (int c=0; c<n_cluster; ++c) {
		// assemble blockers & calculate ratio vectors
		std::vector<std::pair<Sphere, std::vector<float>>> blockers
			= treecut_ratio(hierarchy, cluster_center[c], cluster_radius[c], theta_max, theta_min);
		if (blockers.size() > texwidth || c >= texheight)
			throw "sphere texture overflowing";
		// store into texture data
		for (int i=0; i<blockers.size(); ++i) {
			memcpy(sphdata + c*texwidth*4 + i*4, &blockers[i].first, sizeof(Sphere));
			for (int k=0; k<shorder; ++k)
				ratiodata[(k * texheight + c) * texwidth + i] = blockers[i].second[k];
		}
		cluster_blocker_count[c] = blockers.size();
	}
	// build texture
	glActiveTexture(GL_TEXTURE4);
	create_2D_float_texture(texwidth, texheight, 4, sphdata, GL_NEAREST);
	glActiveTexture(GL_TEXTURE5);
	create_2D_float_texture_array(texwidth, texheight, 1, shorder, ratiodata, GL_NEAREST);
	delete[] sphdata;
	delete[] ratiodata;
	// assign sphere count of each vertex
	for (int recv=0; recv<n; ++recv)
		sphcnt[recv] = cluster_blocker_count[clusterids[recv]];
	// show stats
	int s = 0, max = 0;
	for (int t: cluster_blocker_count) {
		s += t;
		max = std::max(max, t);
	}
	console.log("max #blockers per cluster:", max);
	console.log("avg #blockers per cluster:", 10 * s / n_cluster * 0.1);
}